

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
          (Block2LevelStructArrayCase *this,Context *context,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  Block2LevelStructArrayCase *this_local;
  
  testCtx = gles31::Context::getTestContext(context);
  renderCtx = gles31::Context::getRenderContext(context);
  deqp::gls::UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,renderCtx,name,description,GLSL_VERSION_310_ES,
             bufferMode);
  (this->super_UniformBlockCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Block2LevelStructArrayCase_032bba78;
  this->m_layoutFlags = layoutFlags;
  this->m_numInstances = numInstances;
  return;
}

Assistant:

Block2LevelStructArrayCase (Context& context, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances)
		: UniformBlockCase	(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, bufferMode)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
	}